

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O1

void __thiscall
icu_63::double_conversion::Bignum::SubtractTimes(Bignum *this,Bignum *other,int factor)

{
  uint *puVar1;
  uint *puVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  
  if (factor < 3) {
    if (0 < factor) {
      do {
        SubtractBignum(this,other);
        factor = factor + -1;
      } while (factor != 0);
    }
  }
  else {
    lVar5 = (long)other->exponent_ - (long)this->exponent_;
    iVar8 = other->used_digits_;
    if (iVar8 < 1) {
      uVar7 = 0;
    }
    else {
      puVar1 = (this->bigits_).start_;
      puVar2 = (other->bigits_).start_;
      lVar6 = 0;
      uVar7 = 0;
      do {
        uVar4 = (ulong)uVar7 + (ulong)puVar2[lVar6] * (ulong)(uint)factor;
        uVar7 = puVar1[lVar5 + lVar6] - ((uint)uVar4 & 0xfffffff);
        puVar1[lVar5 + lVar6] = uVar7 & 0xfffffff;
        uVar7 = (int)(uVar4 >> 0x1c) - ((int)uVar7 >> 0x1f);
        lVar6 = lVar6 + 1;
        iVar8 = other->used_digits_;
      } while (lVar6 < iVar8);
    }
    iVar8 = iVar8 + (int)lVar5;
    uVar4 = (ulong)(uint)this->used_digits_;
    if (iVar8 < this->used_digits_) {
      puVar1 = (this->bigits_).start_;
      lVar5 = (long)iVar8;
      do {
        if (uVar7 == 0) {
          return;
        }
        uVar7 = puVar1[lVar5] - uVar7;
        puVar1[lVar5] = uVar7 & 0xfffffff;
        uVar7 = uVar7 >> 0x1f;
        lVar5 = lVar5 + 1;
        uVar4 = (ulong)this->used_digits_;
      } while (lVar5 < (long)uVar4);
    }
    if (0 < (int)uVar4) {
      puVar1 = (this->bigits_).start_;
      uVar4 = uVar4 & 0xffffffff;
      do {
        if (puVar1[uVar4 - 1] != 0) goto LAB_0027d512;
        this->used_digits_ = (int)uVar4 + -1;
        bVar3 = 1 < (long)uVar4;
        uVar4 = uVar4 - 1;
      } while (bVar3);
      uVar4 = 0;
    }
LAB_0027d512:
    if ((int)uVar4 == 0) {
      this->exponent_ = 0;
    }
  }
  return;
}

Assistant:

void Bignum::SubtractTimes(const Bignum& other, int factor) {
  ASSERT(exponent_ <= other.exponent_);
  if (factor < 3) {
    for (int i = 0; i < factor; ++i) {
      SubtractBignum(other);
    }
    return;
  }
  Chunk borrow = 0;
  int exponent_diff = other.exponent_ - exponent_;
  for (int i = 0; i < other.used_digits_; ++i) {
    DoubleChunk product = static_cast<DoubleChunk>(factor) * other.bigits_[i];
    DoubleChunk remove = borrow + product;
    Chunk difference = bigits_[i + exponent_diff] - (remove & kBigitMask);
    bigits_[i + exponent_diff] = difference & kBigitMask;
    borrow = static_cast<Chunk>((difference >> (kChunkSize - 1)) +
                                (remove >> kBigitSize));
  }
  for (int i = other.used_digits_ + exponent_diff; i < used_digits_; ++i) {
    if (borrow == 0) return;
    Chunk difference = bigits_[i] - borrow;
    bigits_[i] = difference & kBigitMask;
    borrow = difference >> (kChunkSize - 1);
  }
  Clamp();
}